

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

char * SimpleString::StrStr(char *s1,char *s2)

{
  char *pcVar1;
  char cVar2;
  size_t n;
  long lVar3;
  long lVar4;
  
  if (*s2 != '\0') {
    cVar2 = *s1;
    while (cVar2 != '\0') {
      lVar3 = -1;
      do {
        lVar4 = lVar3 + 1;
        lVar3 = lVar3 + 1;
      } while (s2[lVar4] != '\0');
      if (lVar3 == 0) {
        return s1;
      }
      lVar4 = 0;
      while ((cVar2 = s1[lVar4], cVar2 != '\0' && (cVar2 == s2[lVar4]))) {
        lVar4 = lVar4 + 1;
        if (lVar3 == lVar4) {
          return s1;
        }
      }
      if (cVar2 == s2[lVar4]) {
        return s1;
      }
      pcVar1 = s1 + 1;
      s1 = s1 + 1;
      cVar2 = *pcVar1;
    }
    s1 = (char *)0x0;
  }
  return s1;
}

Assistant:

const char* SimpleString::StrStr(const char* s1, const char* s2)
{
    if(!*s2) return s1;
    for (; *s1; s1++)
        if (StrNCmp(s1, s2, StrLen(s2)) == 0)
            return s1;
    return NULLPTR;
}